

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::setIconText(QAction *this,QString *text)

{
  bool bVar1;
  QActionPrivate *rhs;
  QString *in_RSI;
  QActionPrivate *in_RDI;
  QActionPrivate *d;
  
  rhs = d_func((QAction *)0x97616c);
  bVar1 = ::operator==(in_RSI,(QString *)rhs);
  if (!bVar1) {
    QString::operator=(&rhs->iconText,(QString *)in_RSI);
    QActionPrivate::sendDataChanged(in_RDI);
  }
  return;
}

Assistant:

void QAction::setIconText(const QString &text)
{
    Q_D(QAction);
    if (d->iconText == text)
        return;

    d->iconText = text;
    d->sendDataChanged();
}